

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

int __thiscall
cxxopts::values::standard_value<bool>::clone
          (standard_value<bool> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  shared_ptr<cxxopts::values::standard_value<bool>_> *in_stack_ffffffffffffffc8;
  standard_value<bool> *this_00;
  
  this_00 = this;
  std::
  make_shared<cxxopts::values::standard_value<bool>,cxxopts::values::standard_value<bool>const&>
            (this);
  std::shared_ptr<cxxopts::Value>::shared_ptr<cxxopts::values::standard_value<bool>,void>
            ((shared_ptr<cxxopts::Value> *)this_00,in_stack_ffffffffffffffc8);
  std::shared_ptr<cxxopts::values::standard_value<bool>_>::~shared_ptr
            ((shared_ptr<cxxopts::values::standard_value<bool>_> *)0x168fe3);
  return (int)this;
}

Assistant:

std::shared_ptr<Value>
      clone() const override
      {
        return std::make_shared<standard_value<bool>>(*this);
      }